

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameWalkWith(Walker *pWalker,Select *pSelect)

{
  Select *p;
  With *pWVar1;
  long lVar2;
  long lVar3;
  NameContext local_68;
  
  pWVar1 = pSelect->pWith;
  if ((pWVar1 != (With *)0x0) && (0 < pWVar1->nCte)) {
    lVar2 = 0x20;
    lVar3 = 0;
    do {
      p = *(Select **)((long)pWVar1->a + lVar2 + -0x10);
      local_68.ncFlags = 0;
      local_68._44_4_ = 0;
      local_68.pWinSelect = (Select *)0x0;
      local_68.pNext = (NameContext *)0x0;
      local_68.nRef = 0;
      local_68.nErr = 0;
      local_68.pSrcList = (SrcList *)0x0;
      local_68.uNC.pEList = (ExprList *)0x0;
      local_68.pParse = pWalker->pParse;
      sqlite3SelectPrep(local_68.pParse,p,&local_68);
      sqlite3WalkSelect(pWalker,p);
      lVar3 = lVar3 + 1;
      pWVar1 = pSelect->pWith;
      lVar2 = lVar2 + 0x20;
    } while (lVar3 < pWVar1->nCte);
  }
  return;
}

Assistant:

static void renameWalkWith(Walker *pWalker, Select *pSelect){
  if( pSelect->pWith ){
    int i;
    for(i=0; i<pSelect->pWith->nCte; i++){
      Select *p = pSelect->pWith->a[i].pSelect;
      NameContext sNC;
      memset(&sNC, 0, sizeof(sNC));
      sNC.pParse = pWalker->pParse;
      sqlite3SelectPrep(sNC.pParse, p, &sNC);
      sqlite3WalkSelect(pWalker, p);
    }
  }
}